

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O3

void gf_25519_sqr(gf_25519_s *cs,gf_25519_s *as)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint64_t hi_1;
  ulong uVar34;
  uint64_t lo_3;
  uint64_t hi;
  uint64_t lo_1;
  ulong uVar35;
  uint64_t hi_3;
  uint64_t lo;
  ulong uVar36;
  
  uVar36 = as->limb[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar36;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar36;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar36 * 2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = as->limb[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar36 * 2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = as->limb[2];
  uVar36 = as->limb[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar36;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar36;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar36 * 0x26;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = as->limb[4];
  uVar36 = as->limb[2] * 0x26;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar36;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = as->limb[3];
  auVar1 = auVar5 * auVar20 + auVar1 * auVar16 + auVar6 * auVar21;
  uVar35 = auVar1._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar36;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = as->limb[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = as->limb[3] * 0x13;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = as->limb[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = as->limb[3] * 0x26;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = as->limb[4];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar1._8_8_ << 0xd | uVar35 >> 0x33;
  auVar31 = auVar7 * auVar22 + auVar2 * auVar17 + auVar8 * auVar23 + auVar31;
  uVar34 = auVar31._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar31._8_8_ << 0xd | uVar34 >> 0x33;
  auVar32 = auVar4 * auVar19 + auVar3 * auVar18 + auVar9 * auVar24 + auVar32;
  cs->limb[2] = auVar32._0_8_ & 0x7ffffffffffff;
  uVar36 = as->limb[0] * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar36;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = as->limb[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar36;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = as->limb[4];
  uVar36 = as->limb[1] * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar36;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = as->limb[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar36;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = as->limb[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = as->limb[4] * 0x13;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = as->limb[4];
  auVar1 = auVar10 * auVar25 + (auVar32 >> 0x33) + auVar12 * auVar27 + auVar14 * auVar29;
  uVar36 = auVar1._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar1._8_8_ << 0xd | uVar36 >> 0x33;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = as->limb[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = as->limb[2];
  cs->limb[3] = uVar36 & 0x7ffffffffffff;
  auVar33 = auVar13 * auVar28 + auVar11 * auVar26 + auVar15 * auVar30 + auVar33;
  uVar36 = auVar33._0_8_;
  cs->limb[4] = uVar36 & 0x7ffffffffffff;
  uVar36 = (auVar33._8_8_ << 0xd | uVar36 >> 0x33) * 0x13 + (uVar35 & 0x7ffffffffffff);
  cs->limb[0] = uVar36 & 0x7ffffffffffff;
  cs->limb[1] = (uVar34 & 0x7ffffffffffff) + (uVar36 >> 0x33);
  return;
}

Assistant:

void gf_sqr (gf_s *__restrict__ cs, const gf as) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rr(ai, ai);
    ai *= 2;
    accum1 = widemul_rm(ai, &a[1]);
    accum2 = widemul_rm(ai, &a[2]);
    
    ai = a[1];
    mac_rr(&accum2, ai, ai);
    ai *= 38;
    mac_rm(&accum0, ai, &a[4]);
    
    ai = a[2] * 38;
    mac_rm(&accum0, ai, &a[3]);
    mac_rm(&accum1, ai, &a[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum1, ai, &a[3]);
    ai *= 2;
    mac_rm(&accum2, ai, &a[4]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = accum2 >> 51;
    
    ai = a[0]*2;
    mac_rm(&accum0, ai, &a[3]);
    accum1 = widemul_rm(ai, &a[4]);
    
    ai = a[1]*2;
    mac_rm(&accum0, ai, &a[2]);
    mac_rm(&accum1, ai, &a[3]);
    
    mac_rr(&accum0, a[4]*19, a[4]);
    mac_rr(&accum1, a[2], a[2]);
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    /* 2^102 * 16 * 5 * 19 * (1+ep) >> 64
     * = 2^(-13 + <13)
     */
    
    uint64_t a1 = shrld(accum1,51);
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}